

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

bool __thiscall
ON_SubDMeshFragment::SetUnmanagedVertexCapacityForExperts
          (ON_SubDMeshFragment *this,size_t vertex_capacity)

{
  bool bVar1;
  
  if ((vertex_capacity < 0x1001) && (bVar1 = ManagedArrays(this), !bVar1)) {
    this->m_vertex_capacity_etc = (ushort)vertex_capacity | this->m_vertex_capacity_etc & 0x6000;
    return true;
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDMeshFragment::SetUnmanagedVertexCapacityForExperts(size_t vertex_capacity)
{
  // Do not check for a non-null m_P.
  // This function is used in expert situations when m_P is null.
  if (vertex_capacity < 0 || vertex_capacity > (size_t)ON_SubDMeshFragment::MaximumVertexCount)
    return ON_SUBD_RETURN_ERROR(false);
  if (ManagedArrays())
  {
    // attempting to convert internally managed memory to externally managed memory
    return ON_SUBD_RETURN_ERROR(false);
  }
  unsigned short etc = m_vertex_capacity_etc &= ON_SubDMeshFragment::EtcMask;
  etc &= ~ON_SubDMeshFragment::EtcManagedArraysBit;
  m_vertex_capacity_etc = ((unsigned short)vertex_capacity) | etc;
  return true;
}